

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_xor_many(size_t number,roaring_bitmap_t **x)

{
  ulong local_30;
  size_t i;
  roaring_bitmap_t *answer;
  roaring_bitmap_t **x_local;
  size_t number_local;
  
  if (number == 0) {
    number_local = (size_t)roaring_bitmap_create();
  }
  else if (number == 1) {
    number_local = (size_t)roaring_bitmap_copy(*x);
  }
  else {
    number_local = (size_t)roaring_bitmap_lazy_xor(*x,x[1]);
    for (local_30 = 2; local_30 < number; local_30 = local_30 + 1) {
      roaring_bitmap_lazy_xor_inplace((roaring_bitmap_t *)number_local,x[local_30]);
    }
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)number_local);
  }
  return (roaring_bitmap_t *)number_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor_many(size_t number,
                                          const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_bitmap_t *answer = roaring_bitmap_lazy_xor(x[0], x[1]);
    for (size_t i = 2; i < number; i++) {
        roaring_bitmap_lazy_xor_inplace(answer, x[i]);
    }
    roaring_bitmap_repair_after_lazy(answer);
    return answer;
}